

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O2

bool __thiscall
ON_Plane::CreateFromNormalYup(ON_Plane *this,ON_3dPoint *P,ON_3dVector *N,ON_3dVector *Y)

{
  ON_3dVector *this_00;
  ON_3dVector *this_01;
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ON_3dVector local_40;
  
  (this->origin).z = P->z;
  dVar1 = P->y;
  (this->origin).x = P->x;
  (this->origin).y = dVar1;
  this_00 = &this->zaxis;
  dVar1 = N->y;
  (this->zaxis).x = N->x;
  (this->zaxis).y = dVar1;
  (this->zaxis).z = N->z;
  bVar2 = ON_3dVector::Unitize(this_00);
  ON_CrossProduct(&local_40,Y,this_00);
  this_01 = &this->xaxis;
  (this->xaxis).z = local_40.z;
  (this->xaxis).x = local_40.x;
  (this->xaxis).y = local_40.y;
  bVar3 = ON_3dVector::Unitize(this_01);
  bVar4 = ON_3dVector::Unitize(this_01);
  if (!bVar4) {
    ON_3dVector::PerpendicularTo(this_01,this_00);
    ON_3dVector::Unitize(this_01);
  }
  ON_CrossProduct(&local_40,this_00,this_01);
  (this->yaxis).z = local_40.z;
  (this->yaxis).x = local_40.x;
  (this->yaxis).y = local_40.y;
  ON_3dVector::Unitize(&this->yaxis);
  UpdateEquation(this);
  return bVar2 && bVar3;
}

Assistant:

bool ON_Plane::CreateFromNormalYup(
  const ON_3dPoint& P,
  const ON_3dVector& N,
  const ON_3dVector& Y
)
{
  origin = P;
  zaxis = N;
  bool b = zaxis.Unitize();
  xaxis = ON_CrossProduct(Y, zaxis);
  b = xaxis.Unitize() && b;
  if (!xaxis.Unitize())
  {
    xaxis.PerpendicularTo(zaxis);
    xaxis.Unitize();
  }

  yaxis = ON_CrossProduct(zaxis, xaxis);
  yaxis.Unitize();
  UpdateEquation();

  return b;
}